

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_jit_in(void)

{
  printf(anon_var_dwarf_36f1);
  return 0xff;
}

Assistant:

int do_jit_in(){
#ifdef _WIN32
	if (get_jit_file()) {
		do_jit();
	}
	else return LVM_SUCCESS;
#else
	printf("不是windows系统暂不支持jit\n");
	return LVM_FAILD;
#endif // _WIN32
	return LVM_SUCCESS;
}